

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O2

void __thiscall
StringType::GenStringMismatch
          (StringType *this,Output *out_cc,Env *env,DataPtr *data,string *pattern)

{
  pointer pcVar1;
  char *pcVar2;
  string tmp;
  string local_48;
  
  pcVar1 = (data->ptr_expr_)._M_dataplus._M_p;
  pcVar2 = Env::RValue(env,end_of_data);
  strfmt_abi_cxx11_(&local_48,"string((const char *) (%s), (const char *) %s).c_str()",pcVar1,pcVar2
                   );
  Output::println(out_cc,"throw binpac::ExceptionStringMismatch(\"%s\", %s, %s);",
                  (this->super_Type).super_Object.location._M_dataplus._M_p,
                  (pattern->_M_dataplus)._M_p,local_48._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void StringType::GenStringMismatch(Output* out_cc, Env* env, const DataPtr& data, string pattern)
	{
	string tmp = strfmt("string((const char *) (%s), (const char *) %s).c_str()", data.ptr_expr(),
	                    env->RValue(end_of_data));
	out_cc->println("throw binpac::ExceptionStringMismatch(\"%s\", %s, %s);", Location(),
	                pattern.c_str(), tmp.c_str());
	}